

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O2

App * __thiscall
CLI::App::_find_subcommand(App *this,string *subc_name,bool ignore_disabled,bool ignore_used)

{
  pointer psVar1;
  element_type *peVar2;
  long lVar3;
  bool bVar4;
  App *pAVar5;
  pointer psVar6;
  string local_70;
  string local_50 [8];
  long local_48;
  
  psVar6 = (this->subcommands_).
           super__Vector_base<std::shared_ptr<CLI::App>,_std::allocator<std::shared_ptr<CLI::App>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  psVar1 = (this->subcommands_).
           super__Vector_base<std::shared_ptr<CLI::App>,_std::allocator<std::shared_ptr<CLI::App>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  do {
    if (psVar6 == psVar1) {
      return (App *)0x0;
    }
    peVar2 = (psVar6->super___shared_ptr<CLI::App,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    if ((peVar2->disabled_ & ignore_disabled) == 0) {
      ::std::__cxx11::string::string(local_50,(string *)&peVar2->name_);
      lVar3 = local_48;
      ::std::__cxx11::string::~string(local_50);
      pAVar5 = (psVar6->super___shared_ptr<CLI::App,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      if (lVar3 == 0) {
        pAVar5 = _find_subcommand(pAVar5,subc_name,ignore_disabled,ignore_used);
        if (pAVar5 != (App *)0x0) {
          return pAVar5;
        }
      }
      else {
        ::std::__cxx11::string::string((string *)&local_70,(string *)subc_name);
        bVar4 = check_name(pAVar5,&local_70);
        ::std::__cxx11::string::~string((string *)&local_70);
        if (bVar4) {
          pAVar5 = (psVar6->super___shared_ptr<CLI::App,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
          if (pAVar5->parsed_ == 0) {
            return pAVar5;
          }
          if (!ignore_used) {
            return pAVar5;
          }
        }
      }
    }
    psVar6 = psVar6 + 1;
  } while( true );
}

Assistant:

App *_find_subcommand(const std::string &subc_name, bool ignore_disabled, bool ignore_used) const noexcept {
        for(const App_p &com : subcommands_) {
            if(com->disabled_ && ignore_disabled)
                continue;
            if(com->get_name().empty()) {
                auto subc = com->_find_subcommand(subc_name, ignore_disabled, ignore_used);
                if(subc != nullptr) {
                    return subc;
                }
            } else if(com->check_name(subc_name)) {
                if((!*com) || !ignore_used)
                    return com.get();
            }
        }
        return nullptr;
    }